

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O0

UniValue * __thiscall
GenerateToAddressRequestHandler::ProcessReply(GenerateToAddressRequestHandler *this,UniValue *reply)

{
  UniValue *this_00;
  UniValue *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue result;
  UniValue *in_stack_fffffffffffffcd8;
  UniValue *in_stack_fffffffffffffce0;
  UniValue *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  UniValue *in_stack_fffffffffffffcf8;
  UniValue *pUVar1;
  UniValue *this_01;
  UniValue *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  allocator<char> local_2a3;
  allocator<char> local_2a2;
  allocator<char> local_2a1 [21];
  JSONRPCVersion in_stack_fffffffffffffd74;
  undefined8 in_stack_fffffffffffffd78;
  UniValue *in_stack_fffffffffffffd80;
  UniValue *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = local_80;
  this_02 = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffcf0);
  UniValue::UniValue(in_stack_fffffffffffffcf8,(VType)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                     (string *)in_stack_fffffffffffffce8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  this_01 = (UniValue *)local_2a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)in_RSI,(allocator<char> *)this_02);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  UniValue::pushKV(in_RSI,(string *)this_02,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(local_2a1);
  pUVar1 = (UniValue *)&local_2a2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)in_RSI,(allocator<char> *)this_02);
  UniValue::get_obj(in_stack_fffffffffffffce0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)in_RSI,(allocator<char> *)this_02);
  this_00 = UniValue::operator[](in_stack_fffffffffffffce8,(string *)in_stack_fffffffffffffce0);
  UniValue::UniValue(this_01,pUVar1);
  UniValue::pushKV(in_RSI,(string *)this_02,in_RDI);
  UniValue::~UniValue(in_stack_fffffffffffffcd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_2a3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd8);
  std::allocator<char>::~allocator(&local_2a2);
  UniValue::UniValue(this_00,in_stack_fffffffffffffce0);
  UniValue::UniValue(this_01,pUVar1);
  std::optional<UniValue>::optional<int,_true>
            ((optional<UniValue> *)this_00,(int *)in_stack_fffffffffffffce0);
  JSONRPCReplyObj(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                  (optional<UniValue> *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
  std::optional<UniValue>::~optional((optional<UniValue> *)in_stack_fffffffffffffcd8);
  UniValue::~UniValue(in_stack_fffffffffffffcd8);
  UniValue::~UniValue(in_stack_fffffffffffffcd8);
  UniValue::~UniValue(in_stack_fffffffffffffcd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_02;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ProcessReply(const UniValue &reply) override
    {
        UniValue result(UniValue::VOBJ);
        result.pushKV("address", address_str);
        result.pushKV("blocks", reply.get_obj()["result"]);
        return JSONRPCReplyObj(std::move(result), NullUniValue, /*id=*/1, JSONRPCVersion::V2);
    }